

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::TypePrinter::printHeapTypeName(TypePrinter *this,HeapType type)

{
  bool bVar1;
  TypeNames local_68;
  TypePrinter *local_20;
  TypePrinter *local_18;
  TypePrinter *this_local;
  HeapType type_local;
  
  local_18 = this;
  this_local = (TypePrinter *)type.id;
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar1) {
    local_20 = this_local;
    print(this,(HeapType)this_local);
  }
  else {
    std::function<wasm::TypeNames_(wasm::HeapType)>::operator()
              (&local_68,&this->generator,(HeapType)this_local);
    wasm::Name::print(&local_68.name,this->os);
    TypeNames::~TypeNames(&local_68);
  }
  return;
}

Assistant:

void TypePrinter::printHeapTypeName(HeapType type) {
  if (type.isBasic()) {
    print(type);
    return;
  }
  generator(type).name.print(os);
#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
}